

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

void ngx_strlow(u_char *dst,u_char *src,size_t n)

{
  byte bVar1;
  size_t local_20;
  size_t n_local;
  u_char *src_local;
  u_char *dst_local;
  
  n_local = (size_t)src;
  src_local = dst;
  for (local_20 = n; local_20 != 0; local_20 = local_20 - 1) {
    if ((*(byte *)n_local < 0x41) || (0x5a < *(byte *)n_local)) {
      bVar1 = *(byte *)n_local;
    }
    else {
      bVar1 = *(byte *)n_local | 0x20;
    }
    *src_local = bVar1;
    src_local = src_local + 1;
    n_local = n_local + 1;
  }
  return;
}

Assistant:

void
ngx_strlow(u_char *dst, u_char *src, size_t n)
{
    while (n) {
        *dst = ngx_tolower(*src);
        dst++;
        src++;
        n--;
    }
}